

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trmm.hpp
# Opt level: O1

void remora::bindings::
     trmm_impl<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::triangular_tag<true,false>>
               (long *e1,size_type *e2)

{
  ulong uVar1;
  size_t __n;
  size_type sVar2;
  ulong uVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  pointer __ptr;
  pointer __ptr_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double *__s;
  ulong uVar13;
  size_t i;
  size_type sVar14;
  ulong uVar15;
  aligned_allocator<double,_64UL> allocator;
  size_type local_d8;
  long local_d0;
  ulong local_c8;
  type Bs;
  type As;
  
  __ptr = boost::alignment::aligned_allocator<double,_64UL>::allocate
                    (&allocator,0x4000,(const_void_pointer)0x0);
  __ptr_00 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (&allocator,0x1fe00,(const_void_pointer)0x0);
  sVar2 = e2[1];
  uVar1 = sVar2 + 0x3fb;
  if (0x3fb < uVar1) {
    uVar3 = e1[1];
    sVar4 = *e2;
    local_d8 = e2[2];
    uVar9 = 0;
    do {
      uVar7 = sVar2 + uVar9 * -0x3fc;
      if (0x3fb < uVar7) {
        uVar7 = 0x3fc;
      }
      if (0x7f < uVar3 + 0x7f) {
        local_c8 = 1;
        local_d0 = 0;
        uVar8 = 0;
        do {
          uVar10 = uVar3 + uVar8 * -0x80;
          if (0x7f < uVar10) {
            uVar10 = 0x80;
          }
          Bs.m_leading_dimension = *e2;
          Bs.m_values = (double *)
                        (uVar8 * 0x400 + e2[2] + Bs.m_leading_dimension * uVar9 * 0x3fc * 8);
          Bs.m_size1 = uVar10;
          Bs.m_size2 = uVar7;
          pack_B_dense<remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>>
                    (&Bs);
          sVar6 = Bs.m_leading_dimension;
          sVar5 = Bs.m_size1;
          if (Bs.m_size2 != 0) {
            __n = Bs.m_size1 * 8;
            __s = Bs.m_values;
            sVar14 = Bs.m_size2;
            do {
              if (sVar5 != 0) {
                memset(__s,0,__n);
              }
              __s = __s + sVar6;
              sVar14 = sVar14 - 1;
            } while (sVar14 != 0);
          }
          lVar11 = 0;
          uVar15 = 0;
          uVar12 = uVar3;
          do {
            uVar13 = 0x80;
            if (uVar12 < 0x80) {
              uVar13 = uVar12;
            }
            As.m_leading_dimension = e1[3];
            As.m_values = (double *)(local_d0 * As.m_leading_dimension + *e1 + lVar11);
            As.m_size1 = uVar13;
            As.m_size2 = uVar10;
            if (uVar8 == uVar15) {
              pack_A_triangular<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>,false>
                        (&As,__ptr);
            }
            else {
              pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>>
                        (&As,__ptr);
            }
            mgemm<double,double,remora::bindings::trmm_block_size<double>>
                      (0x3ff0000000000000,uVar13,uVar7,uVar10,__ptr,__ptr_00,local_d8 + lVar11,1,
                       sVar4);
            uVar15 = uVar15 + 1;
            lVar11 = lVar11 + 0x400;
            uVar12 = uVar12 - 0x80;
          } while (local_c8 != uVar15);
          uVar8 = uVar8 + 1;
          local_c8 = local_c8 + 1;
          local_d0 = local_d0 + 0x400;
        } while (uVar8 != uVar3 + 0x7f >> 7);
      }
      uVar9 = uVar9 + 1;
      local_d8 = local_d8 + sVar4 * 0x1fe0;
    } while (uVar9 != uVar1 / 0x3fc);
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void trmm_impl(
	matrix_expression<E1, cpu_tag> const& e1,
	matrix_expression<E2, cpu_tag> & e2,
	Triangular t
){
	typedef typename std::common_type<typename E1::value_type, typename E2::value_type>::type value_type;
	typedef trmm_block_size<value_type> block_size;

	static const std::size_t AC = block_size::lhs_block_size;
	static const std::size_t BC = block_size::rhs_column_size;

	//obtain uninitialized aligned storage
	boost::alignment::aligned_allocator<value_type,block_size::block::align> allocator;
	value_type* A = allocator.allocate(AC * AC);
	value_type* B = allocator.allocate(AC * BC);

	//figure out number of blocks to use
	const std::size_t  M = e1().size1();
	const std::size_t  N = e2().size2();
	const std::size_t Ab = (M+AC-1) / AC;
	const std::size_t Bb = (N+BC-1) / BC;

	//get access to raw storage of B
	auto storageB = e2().raw_storage();
	auto Bpointer = storageB.values;
	const std::size_t stride1 = E2::orientation::index_M(storageB.leading_dimension,1);
	const std::size_t stride2 = E2::orientation::index_m(storageB.leading_dimension,1);

	for (std::size_t j = 0; j < Bb; ++j) {//columns of B
		std::size_t nc = std::min(BC, N - j * BC);
		//We have to make use of the triangular nature of B and the fact that rhs and storage are the same matrix
		//for upper triangular matrices we can compute whole columns of A starting from the first
		//until we reach the block on the diagonal, where we stop.
		//for lower triangular matrices we start with the last column instead.
		for (std::size_t k0 = 0; k0< Ab; ++k0){//row-blocks of B = column blocks of A.
			std::size_t k = Triangular::is_upper? k0: Ab-k0-1;
			std::size_t kc = std::min(AC, M - k * AC);
			//read block of B
			auto Bs = subrange(e2, k*AC, k*AC + kc, j * BC, j * BC + nc );
			pack_B_dense(Bs, B, block_size());
			Bs.clear();//its going to be overwritten with the result

			//apply block of B to all blocks of A needing it. we will overwrite the real B block as a result of this.
			//this is okay as the block is stored as argument
			std::size_t i_start = Triangular::is_upper? 0: k;
			std::size_t i_end = Triangular::is_upper? k+1: Ab;
			for (std::size_t i = i_start; i < i_end; ++i) {
				std::size_t mc = std::min(AC, M - i * AC);
				auto As = subrange(e1, i * AC, i * AC + mc, k * AC, k * AC + kc);
				if(i == k){
					pack_A_triangular(As, A, block_size(), t);
				}else
					pack_A_dense(As, A, block_size());

				mgemm(
					mc, nc, kc, value_type(1.0), A, B,
					&Bpointer[i*AC * stride1 + j*BC * stride2], stride1, stride2, block_size()
				);
			}
		}
	}
	//free storage
	allocator.deallocate(A,AC * AC);
	allocator.deallocate(B,AC * BC);
}